

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void dg::vr::RelationsAnalyzer::gepGen(ValueRelations *graph,GetElementPtrInst *gep)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ValueRelations *graph_00;
  ValueRelations *in_RDI;
  GetElementPtrInst *otherGep;
  V from;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  iterator it;
  int origChange;
  GetElementPtrInst *origGep;
  int thisChange;
  ValueRelations *in_stack_fffffffffffffe68;
  ValueRelations *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  ValueRelations *this;
  ValueRelations *in_stack_fffffffffffffe90;
  ValueRelations *snd;
  ValueRelations *in_stack_fffffffffffffea0;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_140;
  VectorSet<const_llvm::Value_*> *local_138;
  undefined4 local_12c;
  GetElementPtrInst **in_stack_fffffffffffffee8;
  Type in_stack_fffffffffffffef4;
  Value **in_stack_fffffffffffffef8;
  ValueRelations *in_stack_ffffffffffffff00;
  undefined1 local_b8 [120];
  Value *local_40;
  Value *local_38;
  int local_2c;
  GetElementPtrInst *local_28;
  int local_1c;
  Value *local_18;
  ValueRelations *local_8;
  
  local_8 = in_RDI;
  uVar3 = llvm::GetElementPtrInst::hasAllZeroIndices();
  if ((uVar3 & 1) != 0) {
    in_stack_fffffffffffffea0 = local_8;
    local_18 = llvm::GetElementPtrInst::getPointerOperand((GetElementPtrInst *)0x1cdbb4);
    ValueRelations::setEqual<llvm::GetElementPtrInst_const*,llvm::Value_const*>
              (in_stack_fffffffffffffe70,(GetElementPtrInst **)in_stack_fffffffffffffe68,
               (Value **)0x1cdbd6);
  }
  local_1c = toChange((GetElementPtrInst *)in_stack_fffffffffffffe68);
  snd = local_8;
  llvm::GetElementPtrInst::getPointerOperand((GetElementPtrInst *)0x1cdc04);
  local_28 = ValueRelations::getInstance<llvm::GetElementPtrInst>
                       ((ValueRelations *)
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                        (V)in_stack_fffffffffffffe70);
  if ((((local_28 != (GetElementPtrInst *)0x0) &&
       (local_2c = toChange((GetElementPtrInst *)in_stack_fffffffffffffe68), local_1c != 0)) &&
      (local_2c != 0)) && (local_1c + local_2c == 0)) {
    in_stack_fffffffffffffe90 = local_8;
    local_38 = llvm::GetElementPtrInst::getPointerOperand((GetElementPtrInst *)0x1cdc79);
    ValueRelations::set<llvm::GetElementPtrInst_const*,llvm::Value_const*>
              (in_stack_ffffffffffffff00,(GetElementPtrInst **)in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4,(Value **)in_stack_fffffffffffffee8);
  }
  if (local_1c != 0) {
    local_40 = llvm::GetElementPtrInst::getPointerOperand((GetElementPtrInst *)0x1cdcc3);
    ValueRelations::set<llvm::Value_const*,llvm::GetElementPtrInst_const*>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
               in_stack_fffffffffffffee8);
  }
  this = local_8;
  memset(local_b8,0,8);
  Relations::Relations((Relations *)0x1cdd2a);
  Relations::pt((Relations *)0x1cdd37);
  ValueRelations::begin_buckets
            ((ValueRelations *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (Relations *)in_stack_fffffffffffffe70);
  do {
    ValueRelations::end_buckets(in_stack_fffffffffffffe68);
    bVar1 = vr::operator!=((EdgeIterator *)in_stack_fffffffffffffe70,
                           (EdgeIterator *)in_stack_fffffffffffffe68);
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator
              ((EdgeIterator *)in_stack_fffffffffffffe70);
    if ((bVar1 & 1) == 0) {
      local_12c = 2;
LAB_001cde96:
      RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator
                ((EdgeIterator *)in_stack_fffffffffffffe70);
      return;
    }
    in_stack_fffffffffffffe70 = local_8;
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::operator->((EdgeIterator *)0x1cddad);
    Bucket::RelationEdge::from((RelationEdge *)0x1cddb5);
    local_138 = ValueRelations::getEqual(this,(Handle)CONCAT17(bVar1,in_stack_fffffffffffffe78));
    local_140._M_current =
         (Value **)
         VectorSet<const_llvm::Value_*>::begin
                   ((VectorSet<const_llvm::Value_*> *)in_stack_fffffffffffffe68);
    VectorSet<const_llvm::Value_*>::end((VectorSet<const_llvm::Value_*> *)in_stack_fffffffffffffe68)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_stack_fffffffffffffe68), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator*(&local_140);
      graph_00 = (ValueRelations *)
                 llvm::dyn_cast<llvm::GetElementPtrInst,llvm::Value_const>
                           ((Value *)in_stack_fffffffffffffe70);
      if ((graph_00 != (ValueRelations *)0x0) &&
         (bVar2 = operandsEqual(graph_00,(I)in_stack_fffffffffffffea0,(I)snd,
                                SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0)), bVar2)) {
        ValueRelations::setEqual<llvm::GetElementPtrInst_const*,llvm::GetElementPtrInst_const*>
                  (in_stack_fffffffffffffe70,(GetElementPtrInst **)in_stack_fffffffffffffe68,
                   (GetElementPtrInst **)0x1cde65);
        local_12c = 1;
        goto LAB_001cde96;
      }
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(&local_140);
    }
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::operator++
              ((EdgeIterator *)in_stack_fffffffffffffe70);
  } while( true );
}

Assistant:

void RelationsAnalyzer::gepGen(ValueRelations &graph,
                               const llvm::GetElementPtrInst *gep) {
    if (gep->hasAllZeroIndices())
        graph.setEqual(gep, gep->getPointerOperand());

    int thisChange = toChange(gep);
    if (const auto *origGep = graph.getInstance<llvm::GetElementPtrInst>(
                gep->getPointerOperand())) {
        int origChange = toChange(origGep);
        if (thisChange && origChange && thisChange + origChange == 0)
            graph.set(gep, Relations::EQ, origGep->getPointerOperand());
    }

    if (thisChange)
        graph.set(gep->getPointerOperand(),
                  thisChange == 1 ? Relations::SLT : Relations::SGT, gep);

    for (auto it = graph.begin_buckets(Relations().pt());
         it != graph.end_buckets(); ++it) {
        for (V from : graph.getEqual(it->from())) {
            if (const auto *otherGep =
                        llvm::dyn_cast<llvm::GetElementPtrInst>(from)) {
                if (operandsEqual(graph, gep, otherGep, true)) {
                    graph.setEqual(gep, otherGep);
                    return;
                }
            }
        }
    }
    // TODO something more?
    // indices method gives iterator over indices
}